

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS5837.h
# Opt level: O3

int ms5837_read_eeprom(MS5837 *pMS5837)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  ushort uVar4;
  uint uVar5;
  char cVar6;
  ushort uVar7;
  char *__s;
  long lVar8;
  bool bVar9;
  ushort local_1a;
  
  lVar8 = 0;
  do {
    iVar3 = ms5837_write_command(pMS5837,(byte)lVar8 | 0xa0);
    if (iVar3 != 0) {
LAB_001bf3d7:
      __s = "Error reading data from a MS5837 : ms5837_read_eeprom_coeff failed. ";
      goto LAB_001bf3de;
    }
    local_1a = 0;
    iVar3 = ReadAllI2CBus(&pMS5837->I2CBus,(uint8 *)&local_1a,2);
    if (iVar3 != 0) goto LAB_001bf3d7;
    if ((pMS5837->bSaveRawData != 0) && ((FILE *)pMS5837->pfSaveFile != (FILE *)0x0)) {
      fwrite(&local_1a,2,1,(FILE *)pMS5837->pfSaveFile);
      fflush((FILE *)pMS5837->pfSaveFile);
    }
    uVar2 = local_1a << 8 | local_1a >> 8;
    *(ushort *)((long)pMS5837->eeprom_coeff + lVar8) = uVar2;
    if (uVar2 == 0) goto LAB_001bf3d7;
    lVar8 = lVar8 + 2;
  } while (lVar8 != 0xe);
  uVar2 = pMS5837->eeprom_coeff[0];
  pMS5837->eeprom_coeff[7] = 0;
  pMS5837->eeprom_coeff[0] = uVar2 & 0xfff;
  uVar5 = 0;
  uVar4 = 0;
  do {
    uVar1 = *(ushort *)((long)pMS5837->eeprom_coeff + (ulong)(uVar5 & 0xfffffffe));
    uVar7 = uVar1 & 0xff;
    if ((uVar5 & 1) == 0) {
      uVar7 = uVar1 >> 8;
    }
    uVar4 = uVar4 ^ uVar7;
    cVar6 = -8;
    do {
      uVar1 = uVar4 * 2;
      bVar9 = -1 < (short)uVar4;
      uVar4 = uVar1 ^ 0x3000;
      if (bVar9) {
        uVar4 = uVar1;
      }
      cVar6 = cVar6 + '\x01';
    } while (cVar6 != '\0');
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x10);
  pMS5837->eeprom_coeff[0] = uVar2;
  if ((uVar4 ^ uVar2) < 0x1000) {
    pMS5837->ms5837_coeff_read = 1;
    iVar3 = 0;
  }
  else {
    __s = "Error reading data from a MS5837 : CRC error. ";
LAB_001bf3de:
    puts(__s);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

inline int ms5837_read_eeprom(MS5837* pMS5837)
{
	uint8_t i = 0;

	for (i = 0; i< MS5837_COEFFICIENT_NUMBERS; i++)
	{
		if (ms5837_read_eeprom_coeff(pMS5837, MS5837_PROM_ADDRESS_READ_ADDRESS_0 + i*2, pMS5837->eeprom_coeff+i) != EXIT_SUCCESS)
		{
			printf("Error reading data from a MS5837 : ms5837_read_eeprom_coeff failed. \n");
			return EXIT_FAILURE;
		}
	}

	if (!ms5837_crc_check(pMS5837->eeprom_coeff, (pMS5837->eeprom_coeff[MS5837_CRC_INDEX] & 0xF000)>>12))
	{
		printf("Error reading data from a MS5837 : CRC error. \n");
		return EXIT_FAILURE;
	}

	pMS5837->ms5837_coeff_read = true;

	return EXIT_SUCCESS;
}